

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_simplify_intmod_k(jit_State *J)

{
  uint uVar1;
  bool bVar2;
  TRef TVar3;
  uint uVar4;
  
  uVar1 = (J->fold).right.i;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1 - (uVar1 >> 1 & 0x55555555);
    uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
    bVar2 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2;
    if (bVar2) {
      (J->fold).ins.field_1.o = ' ';
      TVar3 = lj_ir_kint(J,uVar1 - 1);
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    }
    uVar4 = (uint)bVar2;
  }
  return uVar4;
}

Assistant:

LJFOLD(MOD any KINT)
LJFOLDF(simplify_intmod_k)
{
  int32_t k = fright->i;
  lua_assert(k != 0);
  if (k > 0 && (k & (k-1)) == 0) {  /* i % (2^k) ==> i & (2^k-1) */
    fins->o = IR_BAND;
    fins->op2 = lj_ir_kint(J, k-1);
    return RETRYFOLD;
  }
  return NEXTFOLD;
}